

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_bulletproof_rangeproof_verify
              (secp256k1_context *ctx,secp256k1_scratch_space *scratch,
              secp256k1_bulletproof_generators *gens,uchar *proof,size_t plen,uint64_t *min_value,
              secp256k1_pedersen_commitment *commit,size_t n_commits,size_t nbits,
              secp256k1_generator *value_gen,uchar *extra_commit,size_t extra_commit_len)

{
  size_t sVar1;
  int iVar2;
  ulong __n;
  secp256k1_ge *ge;
  secp256k1_ge *__s;
  long lVar3;
  uchar *proof_local;
  uint64_t *minvalue_ptr;
  secp256k1_ge *commitp_ptr;
  secp256k1_ge value_genp;
  
  proof_local = proof;
  if (gens->n < n_commits * nbits * 2) {
    secp256k1_bulletproof_rangeproof_verify_cold_6();
  }
  else if (n_commits == 0) {
    secp256k1_bulletproof_rangeproof_verify_cold_5();
  }
  else if (nbits == 0) {
    secp256k1_bulletproof_rangeproof_verify_cold_4();
  }
  else if (nbits < 0x41) {
    if (extra_commit_len == 0 || extra_commit != (uchar *)0x0) {
      if ((ctx->ecmult_ctx).pre_g == (secp256k1_ge_storage_0_ *)0x0) {
        secp256k1_bulletproof_rangeproof_verify_cold_1();
      }
      else {
        iVar2 = secp256k1_scratch_allocate_frame(scratch,n_commits * 0xb0,1);
        if (iVar2 != 0) {
          sVar1 = scratch->frame;
          if (sVar1 == 0) {
            __s = (secp256k1_ge *)0x0;
          }
          else {
            __n = n_commits * 0x58 + 0xf & 0xfffffffffffffff0;
            if (scratch->offset[sVar1 + 4] < (long)scratch->data[sVar1 + 4] + __n) {
              __s = (secp256k1_ge *)0x0;
            }
            else {
              __s = (secp256k1_ge *)
                    ((long)scratch->data[sVar1 + 4] + (long)scratch->data[sVar1 - 1]);
              memset(__s,0,__n);
              scratch->data[sVar1 + 4] = (void *)((long)scratch->data[sVar1 + 4] + __n);
            }
          }
          lVar3 = n_commits + (n_commits == 0);
          ge = __s;
          do {
            secp256k1_pedersen_commitment_load(ge,commit);
            commit = commit + 1;
            ge = ge + 1;
            lVar3 = lVar3 + -1;
          } while (lVar3 != 0);
          secp256k1_fe_set_b32(&value_genp.x,value_gen->data);
          secp256k1_fe_set_b32(&value_genp.y,value_gen->data + 0x20);
          value_genp.infinity = 0;
          minvalue_ptr = min_value;
          commitp_ptr = __s;
          iVar2 = secp256k1_bulletproof_rangeproof_verify_impl
                            (&ctx->ecmult_ctx,scratch,&proof_local,1,plen,nbits,&minvalue_ptr,
                             &commitp_ptr,n_commits,&value_genp,gens,&extra_commit,&extra_commit_len
                            );
          sVar1 = scratch->frame;
          scratch->frame = sVar1 - 1;
          free(scratch->data[sVar1 - 1]);
          return iVar2;
        }
      }
    }
    else {
      secp256k1_bulletproof_rangeproof_verify_cold_2();
    }
  }
  else {
    secp256k1_bulletproof_rangeproof_verify_cold_3();
  }
  return 0;
}

Assistant:

int secp256k1_bulletproof_rangeproof_verify(const secp256k1_context* ctx, secp256k1_scratch_space *scratch, const secp256k1_bulletproof_generators *gens, const unsigned char *proof, size_t plen,
 const uint64_t *min_value, const secp256k1_pedersen_commitment* commit, size_t n_commits, size_t nbits, const secp256k1_generator *value_gen, const unsigned char *extra_commit, size_t extra_commit_len) {
    int ret;
    size_t i;
    secp256k1_ge *commitp;
    secp256k1_ge value_genp;
    const secp256k1_ge *commitp_ptr;
    const uint64_t *minvalue_ptr;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(scratch != NULL);
    ARG_CHECK(gens != NULL);
    ARG_CHECK(gens->n >= 2 * nbits * n_commits);
    ARG_CHECK(proof != NULL);
    ARG_CHECK(commit != NULL);
    ARG_CHECK(n_commits > 0);
    ARG_CHECK(nbits > 0);
    ARG_CHECK(nbits <= 64);
    ARG_CHECK(value_gen != NULL);
    ARG_CHECK(extra_commit != NULL || extra_commit_len == 0);
    ARG_CHECK(secp256k1_ecmult_context_is_built(&ctx->ecmult_ctx));

    if (!secp256k1_scratch_allocate_frame(scratch, 2 * n_commits * sizeof(secp256k1_ge), 1)) {
        return 0;
    }

    commitp = (secp256k1_ge *)secp256k1_scratch_alloc(scratch, n_commits * sizeof(secp256k1_ge));
    for (i = 0; i < n_commits; i++) {
        secp256k1_pedersen_commitment_load(&commitp[i], &commit[i]);
    }
    secp256k1_generator_load(&value_genp, value_gen);

    commitp_ptr = commitp;
    minvalue_ptr = min_value;
    ret = secp256k1_bulletproof_rangeproof_verify_impl(&ctx->ecmult_ctx, scratch, &proof, 1, plen, nbits, &minvalue_ptr, &commitp_ptr, n_commits, &value_genp, gens, &extra_commit, &extra_commit_len);
    secp256k1_scratch_deallocate_frame(scratch);
    return ret;
}